

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  UnknownField *this_00;
  uint32_t *puVar1;
  ulong uVar2;
  bool bVar3;
  Type value;
  long lVar4;
  string *data;
  UnknownFieldSet *unknown_fields_00;
  pointer pUVar5;
  LogMessage *pLVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  UnknownFieldSet intermediate_unknown_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    pUVar5 = (unknown_fields->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (ulong)((long)(unknown_fields->fields_).
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 4;
    iVar7 = (int)uVar8;
    uVar10 = 0;
    uVar2 = 0;
    if (0 < iVar7) {
      uVar10 = uVar8 & 0xffffffff;
    }
    do {
      uVar8 = uVar2;
      if (uVar10 == uVar8) goto LAB_0036a5ec;
      puVar1 = &pUVar5->number_;
      pUVar5 = pUVar5 + 1;
      uVar2 = uVar8 + 1;
    } while (*puVar1 != *(uint32_t *)(innermost_field + 4));
    std::operator+(&local_50,"Option \"",debug_msg_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &intermediate_unknown_fields,&local_50,"\" was already set.");
    bVar3 = AddNameError(this,(string *)&intermediate_unknown_fields);
    unknown_fields = (UnknownFieldSet *)(ulong)bVar3;
    std::__cxx11::string::~string((string *)&intermediate_unknown_fields);
    std::__cxx11::string::~string((string *)&local_50);
LAB_0036a5ec:
    bVar11 = (long)iVar7 <= (long)uVar8 | (byte)unknown_fields;
  }
  else {
    lVar12 = 0;
    lVar9 = 0;
    while( true ) {
      pUVar5 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(int)((ulong)((long)(unknown_fields->fields_).
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5)
                         >> 4);
      bVar11 = lVar4 <= lVar9;
      if (lVar4 <= lVar9) break;
      if (*(int *)((long)&pUVar5->number_ + lVar12) ==
          *(int *)(*intermediate_fields_iter._M_current + 4)) {
        this_00 = (UnknownField *)((long)&pUVar5->number_ + lVar12);
        value = FieldDescriptor::type(*intermediate_fields_iter._M_current);
        if (value == TYPE_GROUP) {
          if (*(int *)((long)&pUVar5->type_ + lVar12) == 4) {
            unknown_fields_00 = UnknownField::group(this_00);
            bVar3 = ExamineIfOptionIsSet
                              (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                               intermediate_fields_end,innermost_field,debug_msg_name,
                               unknown_fields_00);
            if (!bVar3) break;
          }
        }
        else {
          if (value != TYPE_MESSAGE) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&intermediate_unknown_fields,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1cf9);
            pLVar6 = internal::LogMessage::operator<<
                               ((LogMessage *)&intermediate_unknown_fields,
                                "Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar6);
            internal::LogMessage::~LogMessage((LogMessage *)&intermediate_unknown_fields);
LAB_0036a646:
            bVar11 = 0;
            break;
          }
          if (*(int *)((long)&pUVar5->type_ + lVar12) == 3) {
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            intermediate_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            data = UnknownField::length_delimited_abi_cxx11_(this_00);
            bVar3 = UnknownFieldSet::ParseFromString(&intermediate_unknown_fields,data);
            if (bVar3) {
              bVar3 = ExamineIfOptionIsSet
                                (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,debug_msg_name,
                                 &intermediate_unknown_fields);
              if (!bVar3) {
                UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
                goto LAB_0036a646;
              }
            }
            UnknownFieldSet::~UnknownFieldSet(&intermediate_unknown_fields);
          }
        }
      }
      lVar9 = lVar9 + 1;
      lVar12 = lVar12 + 0x10;
    }
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}